

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_model<char_const*>(TreesIndexer *model,char **in)

{
  size_type __new_size;
  SingleTreeIndex *tree;
  pointer node;
  pointer pSVar1;
  
  if (!interrupt_switch) {
    __new_size = *(size_type *)*in;
    *in = (char *)((long)*in + 8);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize
              (&model->indices,__new_size);
    pSVar1 = (model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pSVar1 != (model->indices).
                  super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>,_true>
      ::_S_do_it(&model->indices);
      pSVar1 = (model->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    for (node = (model->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_start; node != pSVar1; node = node + 1) {
      deserialize_node<char_const*>(node,in);
    }
  }
  return;
}

Assistant:

void deserialize_model(TreesIndexer &model, itype &in)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t>(&vec_size, (size_t)1, in);
    model.indices.resize(vec_size);
    model.indices.shrink_to_fit();
    for (auto &tree : model.indices)
        deserialize_node(tree, in);
}